

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O1

void __thiscall
ArtificialPopulation::ArtificialPopulation(ArtificialPopulation *this,ANN *a,Parameters *param)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  int iVar3;
  uint uVar4;
  DenseStorage<double,__1,__1,__1,_0> local_28;
  
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population).numberOfInputNeurons = 0;
  (this->super_Population).numberOfOutputNeurons = 0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population)._vptr_Population = (_func_int **)&PTR_update_00126ca8;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  iVar3 = ANN::getInputSize(a);
  (this->super_Population).numberOfNeurons = iVar3;
  iVar3 = ANN::getInputSize(a);
  (this->super_Population).numberOfInputNeurons = iVar3;
  iVar3 = ANN::getOutputSize(a);
  (this->super_Population).numberOfOutputNeurons = iVar3;
  Population::initialize(&this->super_Population);
  this->ann = a;
  uVar4 = ANN::getInputSize(a);
  local_28.m_data = (double *)0x0;
  local_28.m_rows = 0;
  local_28.m_cols = 0;
  if (-1 < (int)uVar4) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_28,(ulong)uVar4,1,(ulong)uVar4);
    __ptr = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
    (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = local_28.m_data;
    IVar1 = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    IVar2 = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_28.m_rows;
    (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_28.m_cols;
    local_28.m_data = __ptr;
    local_28.m_rows = IVar1;
    local_28.m_cols = IVar2;
    free(__ptr);
    return;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/PlainObjectBase.h"
                ,0x11d,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

ArtificialPopulation::ArtificialPopulation(ANN* a,  Parameters* param) {
    numberOfNeurons = a->getInputSize();
    numberOfInputNeurons = a->getInputSize();
    numberOfOutputNeurons = a->getOutputSize();
    initialize();
    ann = a;
    annInput = Eigen::MatrixXd(1, ann->getInputSize());
}